

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

void Abc_SclTimeIncCheckLevel(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pObj_00;
  uint local_1c;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  for (local_1c = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), (int)local_1c < iVar2;
      local_1c = local_1c + 1) {
    pObj_00 = Abc_NtkObj(pNtk,local_1c);
    if ((pObj_00 != (Abc_Obj_t *)0x0) &&
       (uVar1 = *(uint *)&pObj_00->field_0x14, uVar3 = Abc_ObjLevelNew(pObj_00),
       uVar1 >> 0xc != uVar3)) {
      printf("Level of node %d is out of date!\n",(ulong)local_1c);
    }
  }
  return;
}

Assistant:

void Abc_SclTimeIncCheckLevel( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( (int)pObj->Level != Abc_ObjLevelNew(pObj) )
            printf( "Level of node %d is out of date!\n", i );
}